

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armci.c
# Opt level: O0

int PARMCI_NbAccS(int optype,void *scale,void *src_ptr,int *src_stride_arr,void *dst_ptr,
                 int *dst_stride_arr,int *count,int stride_levels,int proc,armci_hdl_t *nb_handle)

{
  int iVar1;
  int *in_RCX;
  undefined8 in_RDX;
  int *unaff_RBX;
  int unaff_EBP;
  comex_request_t *in_R8;
  int *in_R9;
  int unaff_retaddr;
  comex_group_t in_stack_00000008;
  undefined4 in_stack_0000000c;
  int in_stack_00000010;
  undefined4 in_stack_00000014;
  undefined8 in_stack_00000020;
  int lcount;
  int i;
  int iret;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  void *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar2;
  undefined4 in_stack_ffffffffffffffbc;
  
  iVar2 = (int)((ulong)in_RDX >> 0x20);
  iVar1 = armci_check_contiguous
                    (in_RCX,in_R9,(int *)CONCAT44(in_stack_0000000c,in_stack_00000008),
                     in_stack_00000010);
  if (iVar1 == 0) {
    iVar1 = comex_nbaccs(iVar2,in_RCX,in_R8,in_R9,
                         (void *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                         (int *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                         unaff_RBX,unaff_EBP,unaff_retaddr,in_stack_00000008,
                         (comex_request_t *)CONCAT44(in_stack_00000014,in_stack_00000010));
  }
  else {
    iVar1 = 1;
    for (iVar2 = 0; iVar2 <= in_stack_00000010; iVar2 = iVar2 + 1) {
      iVar1 = *(int *)(CONCAT44(in_stack_0000000c,in_stack_00000008) + (long)iVar2 * 4) * iVar1;
    }
    iVar1 = comex_nbacc(iVar1,in_stack_ffffffffffffffa8,
                        (void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                        (int)((ulong)in_stack_00000020 >> 0x20),(int)in_stack_00000020,
                        (comex_group_t)in_R9,in_R8);
  }
  return iVar1;
}

Assistant:

int PARMCI_NbAccS(int optype, void *scale, void *src_ptr, int *src_stride_arr, void *dst_ptr, int *dst_stride_arr, int *count, int stride_levels, int proc, armci_hdl_t *nb_handle)
{
  int iret;
  /* check if data is contiguous */
  if (armci_check_contiguous(src_stride_arr, dst_stride_arr, count, stride_levels)) {
    int i;
    int lcount = 1;
    for (i=0; i<=stride_levels; i++) lcount *= count[i];
    iret = comex_nbacc(optype, scale, src_ptr, dst_ptr, lcount, proc,
        COMEX_GROUP_WORLD, nb_handle);
  } else {
    iret = comex_nbaccs(optype, scale, src_ptr, src_stride_arr, dst_ptr,
        dst_stride_arr, count, stride_levels, proc, COMEX_GROUP_WORLD, nb_handle);
  }
  return iret;
}